

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [32];
  undefined1 (*pauVar34) [16];
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  GridSOA *pGVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  GridSOA *pGVar43;
  ulong uVar44;
  Geometry *pGVar45;
  ulong uVar46;
  ulong uVar47;
  undefined4 uVar48;
  ulong unaff_R15;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar55 [16];
  float fVar54;
  float fVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar58 [32];
  undefined1 auVar56 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar57 [16];
  float fVar67;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined4 uVar96;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar107 [64];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar116;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar139 [32];
  float fVar140;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int iStack_1588;
  GridSOA *local_1528;
  ulong local_1520;
  ulong local_1518;
  RTCFilterFunctionNArguments local_1510;
  undefined1 local_14e0 [32];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  Geometry *local_1480;
  undefined1 auStack_1478 [24];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float local_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  GridSOA **local_12e0;
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar42 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar48 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1350._4_4_ = uVar48;
  local_1350._0_4_ = uVar48;
  local_1350._8_4_ = uVar48;
  local_1350._12_4_ = uVar48;
  auVar100 = ZEXT1664(local_1350);
  uVar48 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = uVar48;
  local_1360._0_4_ = uVar48;
  local_1360._8_4_ = uVar48;
  local_1360._12_4_ = uVar48;
  auVar107 = ZEXT1664(local_1360);
  uVar48 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1370._4_4_ = uVar48;
  local_1370._0_4_ = uVar48;
  local_1370._8_4_ = uVar48;
  local_1370._12_4_ = uVar48;
  auVar115 = ZEXT1664(local_1370);
  fVar131 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar54 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar140 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar116 = fVar131 * 0.99999964;
  fVar122 = fVar54 * 0.99999964;
  fVar127 = fVar140 * 0.99999964;
  fVar131 = fVar131 * 1.0000004;
  fVar54 = fVar54 * 1.0000004;
  fVar140 = fVar140 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar35 = (tray->tnear).field_0.i[k];
  local_14b0._4_4_ = iVar35;
  local_14b0._0_4_ = iVar35;
  local_14b0._8_4_ = iVar35;
  local_14b0._12_4_ = iVar35;
  auVar95 = ZEXT1664(local_14b0);
  iVar35 = (tray->tfar).field_0.i[k];
  auVar53 = ZEXT1664(CONCAT412(iVar35,CONCAT48(iVar35,CONCAT44(iVar35,iVar35))));
  iVar35 = 1 << ((uint)k & 0x1f);
  auVar58._4_4_ = iVar35;
  auVar58._0_4_ = iVar35;
  auVar58._8_4_ = iVar35;
  auVar58._12_4_ = iVar35;
  auVar58._16_4_ = iVar35;
  auVar58._20_4_ = iVar35;
  auVar58._24_4_ = iVar35;
  auVar58._28_4_ = iVar35;
  auVar49 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar58 = vpand_avx2(auVar58,auVar49);
  local_11e0 = vpcmpeqd_avx2(auVar58,auVar49);
  fVar119 = fVar116;
  fVar120 = fVar116;
  fVar121 = fVar116;
  fVar124 = fVar122;
  fVar125 = fVar122;
  fVar126 = fVar122;
  fVar128 = fVar127;
  fVar129 = fVar127;
  fVar130 = fVar127;
  fVar65 = fVar131;
  fVar66 = fVar131;
  fVar67 = fVar131;
  fVar68 = fVar54;
  fVar69 = fVar54;
  fVar70 = fVar54;
  fVar101 = fVar140;
  fVar108 = fVar140;
  fVar109 = fVar140;
  local_13d0 = fVar140;
  fStack_13cc = fVar140;
  fStack_13c8 = fVar140;
  fStack_13c4 = fVar140;
  local_13c0 = fVar54;
  fStack_13bc = fVar54;
  fStack_13b8 = fVar54;
  fStack_13b4 = fVar54;
  local_13b0 = fVar131;
  fStack_13ac = fVar131;
  fStack_13a8 = fVar131;
  fStack_13a4 = fVar131;
  local_13a0 = fVar127;
  fStack_139c = fVar127;
  fStack_1398 = fVar127;
  fStack_1394 = fVar127;
  local_1390 = fVar122;
  fStack_138c = fVar122;
  fStack_1388 = fVar122;
  fStack_1384 = fVar122;
  local_1380 = fVar116;
  fStack_137c = fVar116;
  fStack_1378 = fVar116;
  fStack_1374 = fVar116;
  while (pauVar42 != (undefined1 (*) [16])&local_fa0) {
    pauVar34 = pauVar42 + -1;
    pauVar42 = pauVar42 + -1;
    if (*(float *)(*pauVar34 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar37 = *(ulong *)*pauVar42;
      do {
        if ((uVar37 & 8) == 0) {
          auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar41),auVar100._0_16_);
          auVar55._0_4_ = fVar116 * auVar56._0_4_;
          auVar55._4_4_ = fVar119 * auVar56._4_4_;
          auVar55._8_4_ = fVar120 * auVar56._8_4_;
          auVar55._12_4_ = fVar121 * auVar56._12_4_;
          auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar46),auVar107._0_16_);
          auVar71._0_4_ = fVar122 * auVar56._0_4_;
          auVar71._4_4_ = fVar124 * auVar56._4_4_;
          auVar71._8_4_ = fVar125 * auVar56._8_4_;
          auVar71._12_4_ = fVar126 * auVar56._12_4_;
          auVar56 = vmaxps_avx(auVar55,auVar71);
          auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar47),auVar115._0_16_);
          auVar72._0_4_ = fVar127 * auVar55._0_4_;
          auVar72._4_4_ = fVar128 * auVar55._4_4_;
          auVar72._8_4_ = fVar129 * auVar55._8_4_;
          auVar72._12_4_ = fVar130 * auVar55._12_4_;
          auVar55 = vmaxps_avx(auVar72,auVar95._0_16_);
          local_1340 = vmaxps_avx(auVar56,auVar55);
          auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar41 ^ 0x10)),
                               auVar100._0_16_);
          auVar73._0_4_ = fVar131 * auVar56._0_4_;
          auVar73._4_4_ = fVar65 * auVar56._4_4_;
          auVar73._8_4_ = fVar66 * auVar56._8_4_;
          auVar73._12_4_ = fVar67 * auVar56._12_4_;
          auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar46 ^ 0x10)),
                               auVar107._0_16_);
          auVar77._0_4_ = fVar54 * auVar56._0_4_;
          auVar77._4_4_ = fVar68 * auVar56._4_4_;
          auVar77._8_4_ = fVar69 * auVar56._8_4_;
          auVar77._12_4_ = fVar70 * auVar56._12_4_;
          auVar56 = vminps_avx(auVar73,auVar77);
          auVar55 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar47 ^ 0x10)),
                               auVar115._0_16_);
          auVar78._0_4_ = fVar140 * auVar55._0_4_;
          auVar78._4_4_ = fVar101 * auVar55._4_4_;
          auVar78._8_4_ = fVar108 * auVar55._8_4_;
          auVar78._12_4_ = fVar109 * auVar55._12_4_;
          auVar55 = vminps_avx(auVar78,auVar53._0_16_);
          auVar56 = vminps_avx(auVar56,auVar55);
          auVar56 = vcmpps_avx(local_1340,auVar56,2);
          uVar48 = vmovmskps_avx(auVar56);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar48);
        }
        if ((uVar37 & 8) == 0) {
          if (unaff_R15 == 0) {
            iStack_1588 = 4;
          }
          else {
            uVar36 = uVar37 & 0xfffffffffffffff0;
            lVar40 = 0;
            for (uVar37 = unaff_R15; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar40 = lVar40 + 1;
            }
            iStack_1588 = 0;
            uVar44 = unaff_R15 - 1 & unaff_R15;
            uVar37 = *(ulong *)(uVar36 + lVar40 * 8);
            if (uVar44 != 0) {
              uVar2 = *(uint *)(local_1340 + lVar40 * 4);
              lVar40 = 0;
              for (uVar9 = uVar44; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                lVar40 = lVar40 + 1;
              }
              uVar44 = uVar44 - 1 & uVar44;
              uVar9 = *(ulong *)(uVar36 + lVar40 * 8);
              uVar39 = *(uint *)(local_1340 + lVar40 * 4);
              if (uVar44 == 0) {
                if (uVar2 < uVar39) {
                  *(ulong *)*pauVar42 = uVar9;
                  *(uint *)(*pauVar42 + 8) = uVar39;
                  pauVar42 = pauVar42 + 1;
                }
                else {
                  *(ulong *)*pauVar42 = uVar37;
                  *(uint *)(*pauVar42 + 8) = uVar2;
                  uVar37 = uVar9;
                  pauVar42 = pauVar42 + 1;
                }
              }
              else {
                auVar56._8_8_ = 0;
                auVar56._0_8_ = uVar37;
                auVar56 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar2));
                auVar74._8_8_ = 0;
                auVar74._0_8_ = uVar9;
                auVar55 = vpunpcklqdq_avx(auVar74,ZEXT416(uVar39));
                lVar40 = 0;
                for (uVar37 = uVar44; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
                {
                  lVar40 = lVar40 + 1;
                }
                uVar44 = uVar44 - 1 & uVar44;
                auVar79._8_8_ = 0;
                auVar79._0_8_ = *(ulong *)(uVar36 + lVar40 * 8);
                auVar72 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_1340 + lVar40 * 4)));
                auVar71 = vpcmpgtd_avx(auVar55,auVar56);
                if (uVar44 == 0) {
                  auVar73 = vpshufd_avx(auVar71,0xaa);
                  auVar71 = vblendvps_avx(auVar55,auVar56,auVar73);
                  auVar56 = vblendvps_avx(auVar56,auVar55,auVar73);
                  auVar55 = vpcmpgtd_avx(auVar72,auVar71);
                  auVar73 = vpshufd_avx(auVar55,0xaa);
                  auVar55 = vblendvps_avx(auVar72,auVar71,auVar73);
                  auVar71 = vblendvps_avx(auVar71,auVar72,auVar73);
                  auVar72 = vpcmpgtd_avx(auVar71,auVar56);
                  auVar73 = vpshufd_avx(auVar72,0xaa);
                  auVar72 = vblendvps_avx(auVar71,auVar56,auVar73);
                  auVar56 = vblendvps_avx(auVar56,auVar71,auVar73);
                  *pauVar42 = auVar56;
                  pauVar42[1] = auVar72;
                  uVar37 = auVar55._0_8_;
                  pauVar42 = pauVar42 + 2;
                }
                else {
                  lVar40 = 0;
                  for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                    lVar40 = lVar40 + 1;
                  }
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = *(ulong *)(uVar36 + lVar40 * 8);
                  auVar77 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_1340 + lVar40 * 4)));
                  auVar73 = vpshufd_avx(auVar71,0xaa);
                  auVar71 = vblendvps_avx(auVar55,auVar56,auVar73);
                  auVar56 = vblendvps_avx(auVar56,auVar55,auVar73);
                  auVar55 = vpcmpgtd_avx(auVar77,auVar72);
                  auVar73 = vpshufd_avx(auVar55,0xaa);
                  auVar55 = vblendvps_avx(auVar77,auVar72,auVar73);
                  auVar72 = vblendvps_avx(auVar72,auVar77,auVar73);
                  auVar73 = vpcmpgtd_avx(auVar72,auVar56);
                  auVar77 = vpshufd_avx(auVar73,0xaa);
                  auVar73 = vblendvps_avx(auVar72,auVar56,auVar77);
                  auVar56 = vblendvps_avx(auVar56,auVar72,auVar77);
                  auVar72 = vpcmpgtd_avx(auVar55,auVar71);
                  auVar77 = vpshufd_avx(auVar72,0xaa);
                  auVar72 = vblendvps_avx(auVar55,auVar71,auVar77);
                  auVar55 = vblendvps_avx(auVar71,auVar55,auVar77);
                  auVar71 = vpcmpgtd_avx(auVar73,auVar55);
                  auVar77 = vpshufd_avx(auVar71,0xaa);
                  auVar71 = vblendvps_avx(auVar73,auVar55,auVar77);
                  auVar55 = vblendvps_avx(auVar55,auVar73,auVar77);
                  *pauVar42 = auVar56;
                  pauVar42[1] = auVar55;
                  pauVar42[2] = auVar71;
                  auVar95 = ZEXT1664(local_14b0);
                  uVar37 = auVar72._0_8_;
                  pauVar42 = pauVar42 + 3;
                }
              }
            }
          }
        }
        else {
          iStack_1588 = 6;
        }
      } while (iStack_1588 == 0);
      if (iStack_1588 == 6) {
        if (((uint)uVar37 & 0xf) == 8) {
          pGVar38 = (pre->super_Precalculations).grid;
          uVar2 = *(uint *)(pGVar38 + 0xc);
          local_1520 = (ulong)uVar2;
          uVar39 = *(uint *)(pGVar38 + 0x10);
          local_1518 = (ulong)uVar39;
          uVar3 = *(uint *)(pGVar38 + 0x24);
          uVar37 = uVar37 >> 4;
          lVar40 = uVar37 * 4 + (ulong)uVar3;
          auVar56 = *(undefined1 (*) [16])(pGVar38 + local_1520 * 4 + lVar40 + 0x2c);
          auVar55 = auVar56;
          if (2 < local_1518) {
            auVar55 = *(undefined1 (*) [16])
                       (pGVar38 + local_1520 * 8 + uVar37 * 4 + (ulong)uVar3 + 0x2c);
          }
          auVar71 = *(undefined1 (*) [16])(pGVar38 + uVar37 * 4 + (ulong)uVar3 + 0x2c);
          if (local_1520 == 2) {
            auVar71 = vshufps_avx(auVar71,auVar71,0x54);
            auVar56 = vshufps_avx(auVar56,auVar56,0x54);
            auVar55 = vshufps_avx(auVar55,auVar55,0x54);
          }
          uVar37 = (ulong)*(uint *)(pGVar38 + 0x14);
          pGVar43 = pGVar38 + uVar37 * 4 + lVar40 + 0x2c;
          auVar72 = *(undefined1 (*) [16])(pGVar43 + local_1520 * 4);
          auVar73 = auVar72;
          if (2 < uVar39) {
            auVar73 = *(undefined1 (*) [16])(pGVar43 + local_1520 * 8);
          }
          auVar77 = *(undefined1 (*) [16])pGVar43;
          if (uVar2 == 2) {
            auVar77 = vshufps_avx(auVar77,auVar77,0x54);
            auVar72 = vshufps_avx(auVar72,auVar72,0x54);
            auVar73 = vshufps_avx(auVar73,auVar73,0x54);
          }
          pGVar43 = pGVar38 + uVar37 * 8 + lVar40 + 0x2c;
          auVar78 = *(undefined1 (*) [16])(pGVar43 + local_1520 * 4);
          auVar74 = auVar78;
          if (2 < uVar39) {
            auVar74 = *(undefined1 (*) [16])(pGVar43 + local_1520 * 8);
          }
          auVar90._16_16_ = auVar56;
          auVar90._0_16_ = auVar71;
          auVar49._16_16_ = auVar55;
          auVar49._0_16_ = auVar56;
          auVar105 = vunpcklps_avx(auVar90,auVar49);
          auVar58 = vshufps_avx(auVar90,auVar90,0xa5);
          auVar49 = vshufps_avx(auVar49,auVar49,0x94);
          auVar102._16_16_ = auVar72;
          auVar102._0_16_ = auVar77;
          auVar94._16_16_ = auVar73;
          auVar94._0_16_ = auVar72;
          auVar98 = vunpcklps_avx(auVar102,auVar94);
          auVar90 = vshufps_avx(auVar102,auVar102,0xa5);
          auVar94 = vshufps_avx(auVar94,auVar94,0x94);
          auVar56 = *(undefined1 (*) [16])pGVar43;
          if (uVar2 == 2) {
            auVar56 = vshufps_avx(auVar56,auVar56,0x54);
            auVar78 = vshufps_avx(auVar78,auVar78,0x54);
            auVar74 = vshufps_avx(auVar74,auVar74,0x54);
          }
          local_1528 = pGVar38 + uVar37 * 0xc + lVar40 + 0x2c;
          auVar103._16_16_ = auVar78;
          auVar103._0_16_ = auVar56;
          auVar88._16_16_ = auVar74;
          auVar88._0_16_ = auVar78;
          auVar8 = vunpcklps_avx(auVar103,auVar88);
          auVar102 = vshufps_avx(auVar103,auVar103,0xa5);
          local_1440._4_4_ = *(uint *)(pGVar38 + 0x18);
          local_1460._4_4_ = *(undefined4 *)(pGVar38 + 0x1c);
          local_12e0 = &local_1528;
          uVar48 = *(undefined4 *)(ray + k * 4);
          auVar114._4_4_ = uVar48;
          auVar114._0_4_ = uVar48;
          auVar114._8_4_ = uVar48;
          auVar114._12_4_ = uVar48;
          auVar114._16_4_ = uVar48;
          auVar114._20_4_ = uVar48;
          auVar114._24_4_ = uVar48;
          auVar114._28_4_ = uVar48;
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar117._4_4_ = uVar48;
          auVar117._0_4_ = uVar48;
          auVar117._8_4_ = uVar48;
          auVar117._12_4_ = uVar48;
          auVar117._16_4_ = uVar48;
          auVar117._20_4_ = uVar48;
          auVar117._24_4_ = uVar48;
          auVar117._28_4_ = uVar48;
          auVar5 = vshufps_avx(auVar88,auVar88,0x94);
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar139._4_4_ = uVar48;
          auVar139._0_4_ = uVar48;
          auVar139._8_4_ = uVar48;
          auVar139._12_4_ = uVar48;
          auVar139._16_4_ = uVar48;
          auVar139._20_4_ = uVar48;
          auVar139._24_4_ = uVar48;
          auVar139._28_4_ = uVar48;
          auVar105 = vsubps_avx(auVar105,auVar114);
          auVar98 = vsubps_avx(auVar98,auVar117);
          auVar8 = vsubps_avx(auVar8,auVar139);
          auVar58 = vsubps_avx(auVar58,auVar114);
          auVar90 = vsubps_avx(auVar90,auVar117);
          auVar102 = vsubps_avx(auVar102,auVar139);
          auVar49 = vsubps_avx(auVar49,auVar114);
          auVar94 = vsubps_avx(auVar94,auVar117);
          auVar106 = vsubps_avx(auVar5,auVar139);
          auVar88 = vsubps_avx(auVar49,auVar105);
          local_1100 = vsubps_avx(auVar94,auVar98);
          local_10e0 = vsubps_avx(auVar106,auVar8);
          auVar50._0_4_ = auVar49._0_4_ + auVar105._0_4_;
          auVar50._4_4_ = auVar49._4_4_ + auVar105._4_4_;
          auVar50._8_4_ = auVar49._8_4_ + auVar105._8_4_;
          auVar50._12_4_ = auVar49._12_4_ + auVar105._12_4_;
          auVar50._16_4_ = auVar49._16_4_ + auVar105._16_4_;
          auVar50._20_4_ = auVar49._20_4_ + auVar105._20_4_;
          auVar50._24_4_ = auVar49._24_4_ + auVar105._24_4_;
          auVar50._28_4_ = auVar49._28_4_ + auVar105._28_4_;
          auVar80._0_4_ = auVar94._0_4_ + auVar98._0_4_;
          auVar80._4_4_ = auVar94._4_4_ + auVar98._4_4_;
          auVar80._8_4_ = auVar94._8_4_ + auVar98._8_4_;
          auVar80._12_4_ = auVar94._12_4_ + auVar98._12_4_;
          auVar80._16_4_ = auVar94._16_4_ + auVar98._16_4_;
          auVar80._20_4_ = auVar94._20_4_ + auVar98._20_4_;
          auVar80._24_4_ = auVar94._24_4_ + auVar98._24_4_;
          fVar131 = auVar98._28_4_;
          auVar80._28_4_ = auVar94._28_4_ + fVar131;
          fVar101 = auVar8._0_4_;
          auVar83._0_4_ = fVar101 + auVar106._0_4_;
          fVar108 = auVar8._4_4_;
          auVar83._4_4_ = fVar108 + auVar106._4_4_;
          fVar109 = auVar8._8_4_;
          auVar83._8_4_ = fVar109 + auVar106._8_4_;
          fVar110 = auVar8._12_4_;
          auVar83._12_4_ = fVar110 + auVar106._12_4_;
          fVar111 = auVar8._16_4_;
          auVar83._16_4_ = fVar111 + auVar106._16_4_;
          fVar112 = auVar8._20_4_;
          auVar83._20_4_ = fVar112 + auVar106._20_4_;
          fVar113 = auVar8._24_4_;
          auVar83._24_4_ = fVar113 + auVar106._24_4_;
          fVar54 = auVar106._28_4_;
          auVar83._28_4_ = auVar8._28_4_ + fVar54;
          auVar6._4_4_ = local_10e0._4_4_ * auVar80._4_4_;
          auVar6._0_4_ = local_10e0._0_4_ * auVar80._0_4_;
          auVar6._8_4_ = local_10e0._8_4_ * auVar80._8_4_;
          auVar6._12_4_ = local_10e0._12_4_ * auVar80._12_4_;
          auVar6._16_4_ = local_10e0._16_4_ * auVar80._16_4_;
          auVar6._20_4_ = local_10e0._20_4_ * auVar80._20_4_;
          auVar6._24_4_ = local_10e0._24_4_ * auVar80._24_4_;
          auVar6._28_4_ = auVar5._28_4_;
          auVar55 = vfmsub231ps_fma(auVar6,local_1100,auVar83);
          auVar5._4_4_ = auVar88._4_4_ * auVar83._4_4_;
          auVar5._0_4_ = auVar88._0_4_ * auVar83._0_4_;
          auVar5._8_4_ = auVar88._8_4_ * auVar83._8_4_;
          auVar5._12_4_ = auVar88._12_4_ * auVar83._12_4_;
          auVar5._16_4_ = auVar88._16_4_ * auVar83._16_4_;
          auVar5._20_4_ = auVar88._20_4_ * auVar83._20_4_;
          auVar5._24_4_ = auVar88._24_4_ * auVar83._24_4_;
          auVar5._28_4_ = auVar83._28_4_;
          auVar56 = vfmsub231ps_fma(auVar5,local_10e0,auVar50);
          auVar7._4_4_ = local_1100._4_4_ * auVar50._4_4_;
          auVar7._0_4_ = local_1100._0_4_ * auVar50._0_4_;
          auVar7._8_4_ = local_1100._8_4_ * auVar50._8_4_;
          auVar7._12_4_ = local_1100._12_4_ * auVar50._12_4_;
          auVar7._16_4_ = local_1100._16_4_ * auVar50._16_4_;
          auVar7._20_4_ = local_1100._20_4_ * auVar50._20_4_;
          auVar7._24_4_ = local_1100._24_4_ * auVar50._24_4_;
          auVar7._28_4_ = auVar50._28_4_;
          auVar71 = vfmsub231ps_fma(auVar7,auVar88,auVar80);
          uVar48 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar118._4_4_ = uVar48;
          auVar118._0_4_ = uVar48;
          auVar118._8_4_ = uVar48;
          auVar118._12_4_ = uVar48;
          auVar118._16_4_ = uVar48;
          auVar118._20_4_ = uVar48;
          auVar118._24_4_ = uVar48;
          auVar118._28_4_ = uVar48;
          local_1120 = *(float *)(ray + k * 4 + 0xc0);
          auVar51._0_4_ = local_1120 * auVar71._0_4_;
          auVar51._4_4_ = local_1120 * auVar71._4_4_;
          auVar51._8_4_ = local_1120 * auVar71._8_4_;
          auVar51._12_4_ = local_1120 * auVar71._12_4_;
          auVar51._16_4_ = local_1120 * 0.0;
          auVar51._20_4_ = local_1120 * 0.0;
          auVar51._24_4_ = local_1120 * 0.0;
          auVar51._28_4_ = 0;
          auVar56 = vfmadd231ps_fma(auVar51,auVar118,ZEXT1632(auVar56));
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_14e0._4_4_ = uVar48;
          local_14e0._0_4_ = uVar48;
          local_14e0._8_4_ = uVar48;
          local_14e0._12_4_ = uVar48;
          local_14e0._16_4_ = uVar48;
          local_14e0._20_4_ = uVar48;
          local_14e0._24_4_ = uVar48;
          local_14e0._28_4_ = uVar48;
          local_1340 = vfmadd231ps_fma(ZEXT1632(auVar56),local_14e0,ZEXT1632(auVar55));
          local_1140 = vsubps_avx(auVar98,auVar90);
          local_1180 = vsubps_avx(auVar8,auVar102);
          auVar81._0_4_ = auVar90._0_4_ + auVar98._0_4_;
          auVar81._4_4_ = auVar90._4_4_ + auVar98._4_4_;
          auVar81._8_4_ = auVar90._8_4_ + auVar98._8_4_;
          auVar81._12_4_ = auVar90._12_4_ + auVar98._12_4_;
          auVar81._16_4_ = auVar90._16_4_ + auVar98._16_4_;
          auVar81._20_4_ = auVar90._20_4_ + auVar98._20_4_;
          auVar81._24_4_ = auVar90._24_4_ + auVar98._24_4_;
          auVar81._28_4_ = auVar90._28_4_ + fVar131;
          auVar104._0_4_ = fVar101 + auVar102._0_4_;
          auVar104._4_4_ = fVar108 + auVar102._4_4_;
          auVar104._8_4_ = fVar109 + auVar102._8_4_;
          auVar104._12_4_ = fVar110 + auVar102._12_4_;
          auVar104._16_4_ = fVar111 + auVar102._16_4_;
          auVar104._20_4_ = fVar112 + auVar102._20_4_;
          auVar104._24_4_ = fVar113 + auVar102._24_4_;
          auVar104._28_4_ = auVar8._28_4_ + auVar102._28_4_;
          fVar140 = local_1180._0_4_;
          fVar116 = local_1180._4_4_;
          auVar10._4_4_ = auVar81._4_4_ * fVar116;
          auVar10._0_4_ = auVar81._0_4_ * fVar140;
          fVar127 = local_1180._8_4_;
          auVar10._8_4_ = auVar81._8_4_ * fVar127;
          fVar120 = local_1180._12_4_;
          auVar10._12_4_ = auVar81._12_4_ * fVar120;
          fVar124 = local_1180._16_4_;
          auVar10._16_4_ = auVar81._16_4_ * fVar124;
          fVar126 = local_1180._20_4_;
          auVar10._20_4_ = auVar81._20_4_ * fVar126;
          fVar129 = local_1180._24_4_;
          auVar10._24_4_ = auVar81._24_4_ * fVar129;
          auVar10._28_4_ = fVar131;
          auVar55 = vfmsub231ps_fma(auVar10,local_1140,auVar104);
          local_1160 = vsubps_avx(auVar105,auVar58);
          fVar131 = local_1160._0_4_;
          fVar122 = local_1160._4_4_;
          auVar11._4_4_ = auVar104._4_4_ * fVar122;
          auVar11._0_4_ = auVar104._0_4_ * fVar131;
          fVar119 = local_1160._8_4_;
          auVar11._8_4_ = auVar104._8_4_ * fVar119;
          fVar121 = local_1160._12_4_;
          auVar11._12_4_ = auVar104._12_4_ * fVar121;
          fVar125 = local_1160._16_4_;
          auVar11._16_4_ = auVar104._16_4_ * fVar125;
          fVar128 = local_1160._20_4_;
          auVar11._20_4_ = auVar104._20_4_ * fVar128;
          fVar130 = local_1160._24_4_;
          auVar11._24_4_ = auVar104._24_4_ * fVar130;
          auVar11._28_4_ = auVar104._28_4_;
          auVar59._0_4_ = auVar58._0_4_ + auVar105._0_4_;
          auVar59._4_4_ = auVar58._4_4_ + auVar105._4_4_;
          auVar59._8_4_ = auVar58._8_4_ + auVar105._8_4_;
          auVar59._12_4_ = auVar58._12_4_ + auVar105._12_4_;
          auVar59._16_4_ = auVar58._16_4_ + auVar105._16_4_;
          auVar59._20_4_ = auVar58._20_4_ + auVar105._20_4_;
          auVar59._24_4_ = auVar58._24_4_ + auVar105._24_4_;
          auVar59._28_4_ = auVar58._28_4_ + auVar105._28_4_;
          auVar56 = vfmsub231ps_fma(auVar11,local_1180,auVar59);
          fVar132 = local_1140._0_4_;
          fVar133 = local_1140._4_4_;
          auVar12._4_4_ = fVar133 * auVar59._4_4_;
          auVar12._0_4_ = fVar132 * auVar59._0_4_;
          fVar134 = local_1140._8_4_;
          auVar12._8_4_ = fVar134 * auVar59._8_4_;
          fVar135 = local_1140._12_4_;
          auVar12._12_4_ = fVar135 * auVar59._12_4_;
          fVar136 = local_1140._16_4_;
          auVar12._16_4_ = fVar136 * auVar59._16_4_;
          fVar137 = local_1140._20_4_;
          auVar12._20_4_ = fVar137 * auVar59._20_4_;
          fVar138 = local_1140._24_4_;
          auVar12._24_4_ = fVar138 * auVar59._24_4_;
          auVar12._28_4_ = local_1180._28_4_;
          auVar71 = vfmsub231ps_fma(auVar12,local_1160,auVar81);
          auVar84._0_4_ = local_1120 * auVar71._0_4_;
          auVar84._4_4_ = local_1120 * auVar71._4_4_;
          auVar84._8_4_ = local_1120 * auVar71._8_4_;
          auVar84._12_4_ = local_1120 * auVar71._12_4_;
          auVar84._16_4_ = local_1120 * 0.0;
          auVar84._20_4_ = local_1120 * 0.0;
          auVar84._24_4_ = local_1120 * 0.0;
          auVar84._28_4_ = 0;
          auVar56 = vfmadd231ps_fma(auVar84,auVar118,ZEXT1632(auVar56));
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),local_14e0,ZEXT1632(auVar55));
          auVar5 = vsubps_avx(auVar58,auVar49);
          auVar75._0_4_ = auVar58._0_4_ + auVar49._0_4_;
          auVar75._4_4_ = auVar58._4_4_ + auVar49._4_4_;
          auVar75._8_4_ = auVar58._8_4_ + auVar49._8_4_;
          auVar75._12_4_ = auVar58._12_4_ + auVar49._12_4_;
          auVar75._16_4_ = auVar58._16_4_ + auVar49._16_4_;
          auVar75._20_4_ = auVar58._20_4_ + auVar49._20_4_;
          auVar75._24_4_ = auVar58._24_4_ + auVar49._24_4_;
          auVar75._28_4_ = auVar58._28_4_ + auVar49._28_4_;
          auVar6 = vsubps_avx(auVar90,auVar94);
          auVar89._0_4_ = auVar90._0_4_ + auVar94._0_4_;
          auVar89._4_4_ = auVar90._4_4_ + auVar94._4_4_;
          auVar89._8_4_ = auVar90._8_4_ + auVar94._8_4_;
          auVar89._12_4_ = auVar90._12_4_ + auVar94._12_4_;
          auVar89._16_4_ = auVar90._16_4_ + auVar94._16_4_;
          auVar89._20_4_ = auVar90._20_4_ + auVar94._20_4_;
          auVar89._24_4_ = auVar90._24_4_ + auVar94._24_4_;
          auVar89._28_4_ = auVar90._28_4_ + auVar94._28_4_;
          auVar7 = vsubps_avx(auVar102,auVar106);
          auVar60._0_4_ = auVar102._0_4_ + auVar106._0_4_;
          auVar60._4_4_ = auVar102._4_4_ + auVar106._4_4_;
          auVar60._8_4_ = auVar102._8_4_ + auVar106._8_4_;
          auVar60._12_4_ = auVar102._12_4_ + auVar106._12_4_;
          auVar60._16_4_ = auVar102._16_4_ + auVar106._16_4_;
          auVar60._20_4_ = auVar102._20_4_ + auVar106._20_4_;
          auVar60._24_4_ = auVar102._24_4_ + auVar106._24_4_;
          auVar60._28_4_ = auVar102._28_4_ + fVar54;
          auVar106._4_4_ = auVar7._4_4_ * auVar89._4_4_;
          auVar106._0_4_ = auVar7._0_4_ * auVar89._0_4_;
          auVar106._8_4_ = auVar7._8_4_ * auVar89._8_4_;
          auVar106._12_4_ = auVar7._12_4_ * auVar89._12_4_;
          auVar106._16_4_ = auVar7._16_4_ * auVar89._16_4_;
          auVar106._20_4_ = auVar7._20_4_ * auVar89._20_4_;
          auVar106._24_4_ = auVar7._24_4_ * auVar89._24_4_;
          auVar106._28_4_ = fVar54;
          auVar71 = vfmsub231ps_fma(auVar106,auVar6,auVar60);
          auVar13._4_4_ = auVar60._4_4_ * auVar5._4_4_;
          auVar13._0_4_ = auVar60._0_4_ * auVar5._0_4_;
          auVar13._8_4_ = auVar60._8_4_ * auVar5._8_4_;
          auVar13._12_4_ = auVar60._12_4_ * auVar5._12_4_;
          auVar13._16_4_ = auVar60._16_4_ * auVar5._16_4_;
          auVar13._20_4_ = auVar60._20_4_ * auVar5._20_4_;
          auVar13._24_4_ = auVar60._24_4_ * auVar5._24_4_;
          auVar13._28_4_ = auVar60._28_4_;
          auVar55 = vfmsub231ps_fma(auVar13,auVar7,auVar75);
          auVar14._4_4_ = auVar6._4_4_ * auVar75._4_4_;
          auVar14._0_4_ = auVar6._0_4_ * auVar75._0_4_;
          auVar14._8_4_ = auVar6._8_4_ * auVar75._8_4_;
          auVar14._12_4_ = auVar6._12_4_ * auVar75._12_4_;
          auVar14._16_4_ = auVar6._16_4_ * auVar75._16_4_;
          auVar14._20_4_ = auVar6._20_4_ * auVar75._20_4_;
          auVar14._24_4_ = auVar6._24_4_ * auVar75._24_4_;
          auVar14._28_4_ = auVar75._28_4_;
          auVar72 = vfmsub231ps_fma(auVar14,auVar5,auVar89);
          fStack_111c = local_1120;
          fStack_1118 = local_1120;
          fStack_1114 = local_1120;
          fStack_1110 = local_1120;
          fStack_110c = local_1120;
          fStack_1108 = local_1120;
          fStack_1104 = local_1120;
          auVar76._0_4_ = local_1120 * auVar72._0_4_;
          auVar76._4_4_ = local_1120 * auVar72._4_4_;
          auVar76._8_4_ = local_1120 * auVar72._8_4_;
          auVar76._12_4_ = local_1120 * auVar72._12_4_;
          auVar76._16_4_ = local_1120 * 0.0;
          auVar76._20_4_ = local_1120 * 0.0;
          auVar76._24_4_ = local_1120 * 0.0;
          auVar76._28_4_ = 0;
          auVar55 = vfmadd231ps_fma(auVar76,auVar118,ZEXT1632(auVar55));
          auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),local_14e0,ZEXT1632(auVar71));
          auVar57._0_8_ =
               CONCAT44(auVar55._4_4_ + local_1340._4_4_ + auVar56._4_4_,
                        auVar55._0_4_ + local_1340._0_4_ + auVar56._0_4_);
          auVar57._8_4_ = auVar55._8_4_ + local_1340._8_4_ + auVar56._8_4_;
          auVar57._12_4_ = auVar55._12_4_ + local_1340._12_4_ + auVar56._12_4_;
          auVar93._8_4_ = 0x7fffffff;
          auVar93._0_8_ = 0x7fffffff7fffffff;
          auVar93._12_4_ = 0x7fffffff;
          auVar93._16_4_ = 0x7fffffff;
          auVar93._20_4_ = 0x7fffffff;
          auVar93._24_4_ = 0x7fffffff;
          auVar93._28_4_ = 0x7fffffff;
          local_11c0 = ZEXT1632(auVar57);
          auVar102 = local_11c0;
          auVar58 = vandps_avx(ZEXT1632(auVar57),auVar93);
          fVar54 = auVar58._0_4_ * 1.1920929e-07;
          fVar65 = auVar58._4_4_ * 1.1920929e-07;
          auVar15._4_4_ = fVar65;
          auVar15._0_4_ = fVar54;
          fVar66 = auVar58._8_4_ * 1.1920929e-07;
          auVar15._8_4_ = fVar66;
          fVar67 = auVar58._12_4_ * 1.1920929e-07;
          auVar15._12_4_ = fVar67;
          fVar68 = auVar58._16_4_ * 1.1920929e-07;
          auVar15._16_4_ = fVar68;
          fVar69 = auVar58._20_4_ * 1.1920929e-07;
          auVar15._20_4_ = fVar69;
          fVar70 = auVar58._24_4_ * 1.1920929e-07;
          auVar15._24_4_ = fVar70;
          auVar15._28_4_ = auVar58._28_4_;
          local_11a0 = ZEXT1632(local_1340);
          auVar49 = vminps_avx(local_11a0,ZEXT1632(auVar56));
          auVar49 = vminps_avx(auVar49,ZEXT1632(auVar55));
          auVar97._0_8_ = CONCAT44(fVar65,fVar54) ^ 0x8000000080000000;
          auVar97._8_4_ = -fVar66;
          auVar97._12_4_ = -fVar67;
          auVar97._16_4_ = -fVar68;
          auVar97._20_4_ = -fVar69;
          auVar97._24_4_ = -fVar70;
          auVar97._28_4_ = auVar58._28_4_ ^ 0x80000000;
          auVar58 = vcmpps_avx(auVar49,auVar97,5);
          auVar90 = vmaxps_avx(local_11a0,ZEXT1632(auVar56));
          auVar49 = vmaxps_avx(auVar90,ZEXT1632(auVar55));
          auVar49 = vcmpps_avx(auVar49,auVar15,2);
          auVar94 = vorps_avx(auVar58,auVar49);
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar94 >> 0x7f,0) != '\0') ||
                (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0xbf,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar94[0x1f] < '\0') {
            auVar16._4_4_ = fVar133 * local_10e0._4_4_;
            auVar16._0_4_ = fVar132 * local_10e0._0_4_;
            auVar16._8_4_ = fVar134 * local_10e0._8_4_;
            auVar16._12_4_ = fVar135 * local_10e0._12_4_;
            auVar16._16_4_ = fVar136 * local_10e0._16_4_;
            auVar16._20_4_ = fVar137 * local_10e0._20_4_;
            auVar16._24_4_ = fVar138 * local_10e0._24_4_;
            auVar16._28_4_ = auVar49._28_4_;
            auVar17._4_4_ = fVar122 * local_1100._4_4_;
            auVar17._0_4_ = fVar131 * local_1100._0_4_;
            auVar17._8_4_ = fVar119 * local_1100._8_4_;
            auVar17._12_4_ = fVar121 * local_1100._12_4_;
            auVar17._16_4_ = fVar125 * local_1100._16_4_;
            auVar17._20_4_ = fVar128 * local_1100._20_4_;
            auVar17._24_4_ = fVar130 * local_1100._24_4_;
            auVar17._28_4_ = auVar58._28_4_;
            auVar55 = vfmsub213ps_fma(local_1100,local_1180,auVar16);
            auVar18._4_4_ = auVar6._4_4_ * fVar116;
            auVar18._0_4_ = auVar6._0_4_ * fVar140;
            auVar18._8_4_ = auVar6._8_4_ * fVar127;
            auVar18._12_4_ = auVar6._12_4_ * fVar120;
            auVar18._16_4_ = auVar6._16_4_ * fVar124;
            auVar18._20_4_ = auVar6._20_4_ * fVar126;
            auVar18._24_4_ = auVar6._24_4_ * fVar129;
            auVar18._28_4_ = auVar90._28_4_;
            auVar19._4_4_ = fVar122 * auVar7._4_4_;
            auVar19._0_4_ = fVar131 * auVar7._0_4_;
            auVar19._8_4_ = fVar119 * auVar7._8_4_;
            auVar19._12_4_ = fVar121 * auVar7._12_4_;
            auVar19._16_4_ = fVar125 * auVar7._16_4_;
            auVar19._20_4_ = fVar128 * auVar7._20_4_;
            auVar19._24_4_ = fVar130 * auVar7._24_4_;
            auVar19._28_4_ = uVar48;
            auVar71 = vfmsub213ps_fma(auVar7,local_1140,auVar18);
            auVar58 = vandps_avx(auVar16,auVar93);
            auVar49 = vandps_avx(auVar18,auVar93);
            auVar58 = vcmpps_avx(auVar58,auVar49,1);
            local_1240 = vblendvps_avx(ZEXT1632(auVar71),ZEXT1632(auVar55),auVar58);
            auVar20._4_4_ = fVar133 * auVar5._4_4_;
            auVar20._0_4_ = fVar132 * auVar5._0_4_;
            auVar20._8_4_ = fVar134 * auVar5._8_4_;
            auVar20._12_4_ = fVar135 * auVar5._12_4_;
            auVar20._16_4_ = fVar136 * auVar5._16_4_;
            auVar20._20_4_ = fVar137 * auVar5._20_4_;
            auVar20._24_4_ = fVar138 * auVar5._24_4_;
            auVar20._28_4_ = auVar58._28_4_;
            auVar55 = vfmsub213ps_fma(auVar5,local_1180,auVar19);
            auVar21._4_4_ = auVar88._4_4_ * fVar116;
            auVar21._0_4_ = auVar88._0_4_ * fVar140;
            auVar21._8_4_ = auVar88._8_4_ * fVar127;
            auVar21._12_4_ = auVar88._12_4_ * fVar120;
            auVar21._16_4_ = auVar88._16_4_ * fVar124;
            auVar21._20_4_ = auVar88._20_4_ * fVar126;
            auVar21._24_4_ = auVar88._24_4_ * fVar129;
            auVar21._28_4_ = auVar49._28_4_;
            auVar71 = vfmsub213ps_fma(local_10e0,local_1160,auVar21);
            auVar58 = vandps_avx(auVar21,auVar93);
            auVar49 = vandps_avx(auVar19,auVar93);
            auVar58 = vcmpps_avx(auVar58,auVar49,1);
            local_1220 = vblendvps_avx(ZEXT1632(auVar55),ZEXT1632(auVar71),auVar58);
            auVar55 = vfmsub213ps_fma(auVar88,local_1140,auVar17);
            auVar71 = vfmsub213ps_fma(auVar6,local_1160,auVar20);
            auVar58 = vandps_avx(auVar17,auVar93);
            auVar49 = vandps_avx(auVar20,auVar93);
            auVar58 = vcmpps_avx(auVar58,auVar49,1);
            local_1200 = vblendvps_avx(ZEXT1632(auVar71),ZEXT1632(auVar55),auVar58);
            auVar55 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
            auVar22._4_4_ = local_1200._4_4_ * local_1120;
            auVar22._0_4_ = local_1200._0_4_ * local_1120;
            auVar22._8_4_ = local_1200._8_4_ * local_1120;
            auVar22._12_4_ = local_1200._12_4_ * local_1120;
            auVar22._16_4_ = local_1200._16_4_ * local_1120;
            auVar22._20_4_ = local_1200._20_4_ * local_1120;
            auVar22._24_4_ = local_1200._24_4_ * local_1120;
            auVar22._28_4_ = auVar94._28_4_;
            auVar71 = vfmadd213ps_fma(auVar118,local_1220,auVar22);
            auVar71 = vfmadd213ps_fma(local_14e0,local_1240,ZEXT1632(auVar71));
            auVar90 = ZEXT1632(CONCAT412(auVar71._12_4_ + auVar71._12_4_,
                                         CONCAT48(auVar71._8_4_ + auVar71._8_4_,
                                                  CONCAT44(auVar71._4_4_ + auVar71._4_4_,
                                                           auVar71._0_4_ + auVar71._0_4_))));
            auVar23._4_4_ = local_1200._4_4_ * fVar108;
            auVar23._0_4_ = local_1200._0_4_ * fVar101;
            auVar23._8_4_ = local_1200._8_4_ * fVar109;
            auVar23._12_4_ = local_1200._12_4_ * fVar110;
            auVar23._16_4_ = local_1200._16_4_ * fVar111;
            auVar23._20_4_ = local_1200._20_4_ * fVar112;
            auVar23._24_4_ = local_1200._24_4_ * fVar113;
            auVar23._28_4_ = auVar94._28_4_;
            auVar71 = vfmadd213ps_fma(auVar98,local_1220,auVar23);
            auVar72 = vfmadd213ps_fma(auVar105,local_1240,ZEXT1632(auVar71));
            auVar58 = vrcpps_avx(auVar90);
            auVar123._8_4_ = 0x3f800000;
            auVar123._0_8_ = &DAT_3f8000003f800000;
            auVar123._12_4_ = 0x3f800000;
            auVar123._16_4_ = 0x3f800000;
            auVar123._20_4_ = 0x3f800000;
            auVar123._24_4_ = 0x3f800000;
            auVar123._28_4_ = 0x3f800000;
            auVar71 = vfnmadd213ps_fma(auVar58,auVar90,auVar123);
            auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar58,auVar58);
            local_14a0 = ZEXT1632(CONCAT412(auVar71._12_4_ * (auVar72._12_4_ + auVar72._12_4_),
                                            CONCAT48(auVar71._8_4_ * (auVar72._8_4_ + auVar72._8_4_)
                                                     ,CONCAT44(auVar71._4_4_ *
                                                               (auVar72._4_4_ + auVar72._4_4_),
                                                               auVar71._0_4_ *
                                                               (auVar72._0_4_ + auVar72._0_4_)))));
            uVar48 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar105._4_4_ = uVar48;
            auVar105._0_4_ = uVar48;
            auVar105._8_4_ = uVar48;
            auVar105._12_4_ = uVar48;
            auVar105._16_4_ = uVar48;
            auVar105._20_4_ = uVar48;
            auVar105._24_4_ = uVar48;
            auVar105._28_4_ = uVar48;
            uVar48 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar98._4_4_ = uVar48;
            auVar98._0_4_ = uVar48;
            auVar98._8_4_ = uVar48;
            auVar98._12_4_ = uVar48;
            auVar98._16_4_ = uVar48;
            auVar98._20_4_ = uVar48;
            auVar98._24_4_ = uVar48;
            auVar98._28_4_ = uVar48;
            auVar58 = vcmpps_avx(auVar105,local_14a0,2);
            auVar49 = vcmpps_avx(local_14a0,auVar98,2);
            auVar58 = vandps_avx(auVar58,auVar49);
            auVar71 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
            auVar55 = vpand_avx(auVar71,auVar55);
            auVar58 = vpmovsxwd_avx2(auVar55);
            if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar58 >> 0x7f,0) != '\0') ||
                  (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar58 >> 0xbf,0) != '\0') ||
                (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar58[0x1f] < '\0') {
              auVar58 = vcmpps_avx(auVar90,_DAT_02020f00,4);
              auVar71 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
              auVar55 = vpand_avx(auVar55,auVar71);
              local_12c0 = vpmovsxwd_avx2(auVar55);
              if ((((((((local_12c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_12c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_12c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_12c0 >> 0x7f,0) != '\0') ||
                    (local_12c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_12c0 >> 0xbf,0) != '\0') ||
                  (local_12c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_12c0[0x1f] < '\0') {
                uStack_1330 = 0;
                uStack_1328 = 0;
                local_1320 = ZEXT1632(auVar56);
                local_11c0._8_8_ = auVar57._8_8_;
                local_1300 = auVar57._0_8_;
                uStack_12f8 = local_11c0._8_8_;
                uStack_12f0 = 0;
                uStack_12e8 = 0;
                local_12e0 = &local_1528;
                local_1260 = local_14a0;
                pGVar45 = (context->scene->geometries).items[local_1440._4_4_].ptr;
                if ((pGVar45->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar90 = ZEXT1632(CONCAT88(local_11c0._8_8_,auVar57._0_8_));
                  auVar49 = vrcpps_avx(auVar90);
                  auVar58 = vandps_avx(auVar90,auVar93);
                  auVar85._8_4_ = 0x219392ef;
                  auVar85._0_8_ = 0x219392ef219392ef;
                  auVar85._12_4_ = 0x219392ef;
                  auVar85._16_4_ = 0x219392ef;
                  auVar85._20_4_ = 0x219392ef;
                  auVar85._24_4_ = 0x219392ef;
                  auVar85._28_4_ = 0x219392ef;
                  auVar58 = vcmpps_avx(auVar58,auVar85,5);
                  auVar86._8_4_ = 0x3f800000;
                  auVar86._0_8_ = &DAT_3f8000003f800000;
                  auVar86._12_4_ = 0x3f800000;
                  auVar86._16_4_ = 0x3f800000;
                  auVar86._20_4_ = 0x3f800000;
                  auVar86._24_4_ = 0x3f800000;
                  auVar86._28_4_ = 0x3f800000;
                  auVar55 = vfnmadd213ps_fma(auVar90,auVar49,auVar86);
                  auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar49,auVar49);
                  auVar58 = vandps_avx(auVar58,ZEXT1632(auVar55));
                  auVar61._0_4_ = auVar58._0_4_ * local_1340._0_4_;
                  auVar61._4_4_ = auVar58._4_4_ * local_1340._4_4_;
                  auVar61._8_4_ = auVar58._8_4_ * local_1340._8_4_;
                  auVar61._12_4_ = auVar58._12_4_ * local_1340._12_4_;
                  auVar61._16_4_ = auVar58._16_4_ * 0.0;
                  auVar61._20_4_ = auVar58._20_4_ * 0.0;
                  auVar61._24_4_ = auVar58._24_4_ * 0.0;
                  auVar61._28_4_ = 0;
                  auVar49 = vminps_avx(auVar61,auVar86);
                  auVar24._4_4_ = auVar58._4_4_ * auVar56._4_4_;
                  auVar24._0_4_ = auVar58._0_4_ * auVar56._0_4_;
                  auVar24._8_4_ = auVar58._8_4_ * auVar56._8_4_;
                  auVar24._12_4_ = auVar58._12_4_ * auVar56._12_4_;
                  auVar24._16_4_ = auVar58._16_4_ * 0.0;
                  auVar24._20_4_ = auVar58._20_4_ * 0.0;
                  auVar24._24_4_ = auVar58._24_4_ * 0.0;
                  auVar24._28_4_ = auVar58._28_4_;
                  auVar58 = vminps_avx(auVar24,auVar86);
                  auVar56 = *(undefined1 (*) [16])(local_1528 + local_1520 * 4);
                  auVar55 = auVar56;
                  if (2 < local_1518) {
                    auVar55 = *(undefined1 (*) [16])(local_1528 + local_1520 * 8);
                  }
                  auVar71 = *(undefined1 (*) [16])local_1528;
                  if (local_1520 == 2) {
                    auVar71 = vpshufd_avx(auVar71,0x54);
                    auVar56 = vpshufd_avx(auVar56,0x54);
                    auVar55 = vpshufd_avx(auVar55,0x54);
                  }
                  auVar91._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar71;
                  auVar91._16_16_ = ZEXT116(1) * auVar56;
                  auVar82._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar56;
                  auVar82._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
                  auVar90 = vpunpckldq_avx2(auVar91,auVar82);
                  auVar105 = vpshufd_avx2(auVar91,0xa5);
                  auVar5 = vpshufd_avx2(auVar82,0x94);
                  auVar94 = vpsrld_avx2(auVar90,0x10);
                  auVar90 = vpblendw_avx2(auVar90,ZEXT1632((undefined1  [16])0x0),0xaa);
                  auVar90 = vcvtdq2ps_avx(auVar90);
                  auVar94 = vcvtdq2ps_avx(auVar94);
                  auVar98 = vpsrld_avx2(auVar105,0x10);
                  auVar105 = vpblendw_avx2(auVar105,ZEXT1632((undefined1  [16])0x0),0xaa);
                  auVar105 = vcvtdq2ps_avx(auVar105);
                  auVar98 = vcvtdq2ps_avx(auVar98);
                  auVar106 = vpsrld_avx2(auVar5,0x10);
                  auVar5 = vpblendw_avx2(auVar5,ZEXT1632((undefined1  [16])0x0),0xaa);
                  auVar5 = vcvtdq2ps_avx(auVar5);
                  auVar106 = vcvtdq2ps_avx(auVar106);
                  auVar92._0_4_ =
                       auVar106._0_4_ * 0.00012207031 * auVar58._0_4_ +
                       auVar49._0_4_ * auVar98._0_4_ * 0.00012207031;
                  auVar92._4_4_ =
                       auVar106._4_4_ * 0.00012207031 * auVar58._4_4_ +
                       auVar49._4_4_ * auVar98._4_4_ * 0.00012207031;
                  auVar92._8_4_ =
                       auVar106._8_4_ * 0.00012207031 * auVar58._8_4_ +
                       auVar49._8_4_ * auVar98._8_4_ * 0.00012207031;
                  auVar92._12_4_ =
                       auVar106._12_4_ * 0.00012207031 * auVar58._12_4_ +
                       auVar49._12_4_ * auVar98._12_4_ * 0.00012207031;
                  auVar92._16_4_ =
                       auVar106._16_4_ * 0.00012207031 * auVar58._16_4_ +
                       auVar49._16_4_ * auVar98._16_4_ * 0.00012207031;
                  auVar92._20_4_ =
                       auVar106._20_4_ * 0.00012207031 * auVar58._20_4_ +
                       auVar49._20_4_ * auVar98._20_4_ * 0.00012207031;
                  auVar92._24_4_ =
                       auVar106._24_4_ * 0.00012207031 * auVar58._24_4_ +
                       auVar49._24_4_ * auVar98._24_4_ * 0.00012207031;
                  auVar92._28_4_ = auVar105._28_4_ + auVar98._28_4_;
                  auVar99._8_4_ = 0x3f800000;
                  auVar99._0_8_ = &DAT_3f8000003f800000;
                  auVar99._12_4_ = 0x3f800000;
                  auVar99._16_4_ = 0x3f800000;
                  auVar99._20_4_ = 0x3f800000;
                  auVar99._24_4_ = 0x3f800000;
                  auVar99._28_4_ = 0x3f800000;
                  auVar98 = vsubps_avx(auVar99,auVar49);
                  auVar98 = vsubps_avx(auVar98,auVar58);
                  local_12a0[1] =
                       auVar58._4_4_ * auVar5._4_4_ * 0.00012207031 +
                       auVar49._4_4_ * auVar105._4_4_ * 0.00012207031 +
                       auVar98._4_4_ * auVar90._4_4_ * 0.00012207031;
                  local_12a0[0] =
                       auVar58._0_4_ * auVar5._0_4_ * 0.00012207031 +
                       auVar49._0_4_ * auVar105._0_4_ * 0.00012207031 +
                       auVar98._0_4_ * auVar90._0_4_ * 0.00012207031;
                  local_12a0[2] =
                       auVar58._8_4_ * auVar5._8_4_ * 0.00012207031 +
                       auVar49._8_4_ * auVar105._8_4_ * 0.00012207031 +
                       auVar98._8_4_ * auVar90._8_4_ * 0.00012207031;
                  local_12a0[3] =
                       auVar58._12_4_ * auVar5._12_4_ * 0.00012207031 +
                       auVar49._12_4_ * auVar105._12_4_ * 0.00012207031 +
                       auVar98._12_4_ * auVar90._12_4_ * 0.00012207031;
                  fStack_1290 = auVar58._16_4_ * auVar5._16_4_ * 0.00012207031 +
                                auVar49._16_4_ * auVar105._16_4_ * 0.00012207031 +
                                auVar98._16_4_ * auVar90._16_4_ * 0.00012207031;
                  fStack_128c = auVar58._20_4_ * auVar5._20_4_ * 0.00012207031 +
                                auVar49._20_4_ * auVar105._20_4_ * 0.00012207031 +
                                auVar98._20_4_ * auVar90._20_4_ * 0.00012207031;
                  fStack_1288 = auVar58._24_4_ * auVar5._24_4_ * 0.00012207031 +
                                auVar49._24_4_ * auVar105._24_4_ * 0.00012207031 +
                                auVar98._24_4_ * auVar90._24_4_ * 0.00012207031;
                  fStack_1284 = auVar5._28_4_ + auVar105._28_4_ + auVar58._28_4_;
                  local_1280[1] = auVar92._4_4_ + auVar98._4_4_ * auVar94._4_4_ * 0.00012207031;
                  local_1280[0] = auVar92._0_4_ + auVar98._0_4_ * auVar94._0_4_ * 0.00012207031;
                  local_1280[2] = auVar92._8_4_ + auVar98._8_4_ * auVar94._8_4_ * 0.00012207031;
                  local_1280[3] = auVar92._12_4_ + auVar98._12_4_ * auVar94._12_4_ * 0.00012207031;
                  fStack_1270 = auVar92._16_4_ + auVar98._16_4_ * auVar94._16_4_ * 0.00012207031;
                  fStack_126c = auVar92._20_4_ + auVar98._20_4_ * auVar94._20_4_ * 0.00012207031;
                  fStack_1268 = auVar92._24_4_ + auVar98._24_4_ * auVar94._24_4_ * 0.00012207031;
                  fStack_1264 = auVar92._28_4_ + auVar98._28_4_;
                  auVar53 = ZEXT3264(local_14a0);
                  auVar62._8_4_ = 0x7f800000;
                  auVar62._0_8_ = 0x7f8000007f800000;
                  auVar62._12_4_ = 0x7f800000;
                  auVar62._16_4_ = 0x7f800000;
                  auVar62._20_4_ = 0x7f800000;
                  auVar62._24_4_ = 0x7f800000;
                  auVar62._28_4_ = 0x7f800000;
                  auVar58 = vblendvps_avx(auVar62,local_14a0,local_12c0);
                  auVar49 = vshufps_avx(auVar58,auVar58,0xb1);
                  auVar49 = vminps_avx(auVar58,auVar49);
                  auVar90 = vshufpd_avx(auVar49,auVar49,5);
                  auVar49 = vminps_avx(auVar49,auVar90);
                  auVar90 = vpermpd_avx2(auVar49,0x4e);
                  auVar49 = vminps_avx(auVar49,auVar90);
                  auVar49 = vcmpps_avx(auVar58,auVar49,0);
                  auVar90 = local_12c0 & auVar49;
                  auVar58 = local_12c0;
                  if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar90 >> 0x7f,0) != '\0') ||
                        (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar90 >> 0xbf,0) != '\0') ||
                      (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar90[0x1f] < '\0') {
                    auVar58 = vandps_avx(auVar49,local_12c0);
                  }
                  auVar49 = vpcmpeqd_avx2(auVar92,auVar92);
                  auVar95 = ZEXT3264(auVar49);
                  uVar39 = vmovmskps_avx(auVar58);
                  uVar2 = 0;
                  for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x80000000) {
                    uVar2 = uVar2 + 1;
                  }
                  uVar37 = (ulong)uVar2;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar45->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar131 = local_12a0[uVar37];
                    fVar54 = local_1280[uVar37];
                    uVar48 = *(undefined4 *)(local_1240 + uVar37 * 4);
                    uVar1 = *(undefined4 *)(local_1220 + uVar37 * 4);
                    uVar96 = *(undefined4 *)(local_1200 + uVar37 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1260 + uVar37 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar48;
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar96;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar131;
                    *(float *)(ray + k * 4 + 0x200) = fVar54;
                    *(undefined4 *)(ray + k * 4 + 0x220) = local_1460._4_4_;
                    *(uint *)(ray + k * 4 + 0x240) = local_1440._4_4_;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_1440._0_4_ = local_1440._4_4_;
                    uStack_1438._0_4_ = local_1440._4_4_;
                    uStack_1438._4_4_ = local_1440._4_4_;
                    uStack_1430._0_4_ = local_1440._4_4_;
                    uStack_1430._4_4_ = local_1440._4_4_;
                    uStack_1428._0_4_ = local_1440._4_4_;
                    uStack_1428._4_4_ = local_1440._4_4_;
                    local_1460._0_4_ = local_1460._4_4_;
                    uStack_1458._0_4_ = local_1460._4_4_;
                    uStack_1458._4_4_ = local_1460._4_4_;
                    uStack_1450._0_4_ = local_1460._4_4_;
                    uStack_1450._4_4_ = local_1460._4_4_;
                    uStack_1448._0_4_ = local_1460._4_4_;
                    uStack_1448._4_4_ = local_1460._4_4_;
                    auStack_1478 = auVar8._8_24_;
                    local_1480 = pGVar45;
                    local_1420 = local_12c0;
                    local_11c0 = auVar102;
                    do {
                      uVar96 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_1060 = local_12a0[uVar37];
                      local_1040 = local_1280[uVar37];
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_1260 + uVar37 * 4);
                      uVar48 = *(undefined4 *)(local_1240 + uVar37 * 4);
                      uVar1 = *(undefined4 *)(local_1220 + uVar37 * 4);
                      local_10a0._4_4_ = uVar1;
                      local_10a0._0_4_ = uVar1;
                      local_10a0._8_4_ = uVar1;
                      local_10a0._12_4_ = uVar1;
                      local_10a0._16_4_ = uVar1;
                      local_10a0._20_4_ = uVar1;
                      local_10a0._24_4_ = uVar1;
                      local_10a0._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)(local_1200 + uVar37 * 4);
                      local_1080._4_4_ = uVar1;
                      local_1080._0_4_ = uVar1;
                      local_1080._8_4_ = uVar1;
                      local_1080._12_4_ = uVar1;
                      local_1080._16_4_ = uVar1;
                      local_1080._20_4_ = uVar1;
                      local_1080._24_4_ = uVar1;
                      local_1080._28_4_ = uVar1;
                      local_1510.context = context->user;
                      local_10c0[0] = (RTCHitN)(char)uVar48;
                      local_10c0[1] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[2] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[3] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      local_10c0[4] = (RTCHitN)(char)uVar48;
                      local_10c0[5] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[6] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[7] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      local_10c0[8] = (RTCHitN)(char)uVar48;
                      local_10c0[9] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[10] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[0xb] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      local_10c0[0xc] = (RTCHitN)(char)uVar48;
                      local_10c0[0xd] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[0xe] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[0xf] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      local_10c0[0x10] = (RTCHitN)(char)uVar48;
                      local_10c0[0x11] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[0x12] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[0x13] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      local_10c0[0x14] = (RTCHitN)(char)uVar48;
                      local_10c0[0x15] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[0x16] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[0x17] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      local_10c0[0x18] = (RTCHitN)(char)uVar48;
                      local_10c0[0x19] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      local_10c0[0x1c] = (RTCHitN)(char)uVar48;
                      local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar48 >> 8);
                      local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
                      local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
                      fStack_105c = local_1060;
                      fStack_1058 = local_1060;
                      fStack_1054 = local_1060;
                      fStack_1050 = local_1060;
                      fStack_104c = local_1060;
                      fStack_1048 = local_1060;
                      fStack_1044 = local_1060;
                      fStack_103c = local_1040;
                      fStack_1038 = local_1040;
                      fStack_1034 = local_1040;
                      fStack_1030 = local_1040;
                      fStack_102c = local_1040;
                      fStack_1028 = local_1040;
                      fStack_1024 = local_1040;
                      local_1020 = local_1460;
                      uStack_1018 = uStack_1458;
                      uStack_1010 = uStack_1450;
                      uStack_1008 = uStack_1448;
                      local_1000 = local_1440;
                      uStack_ff8 = uStack_1438;
                      uStack_ff0 = uStack_1430;
                      uStack_fe8 = uStack_1428;
                      uStack_fdc = (local_1510.context)->instID[0];
                      local_fe0 = uStack_fdc;
                      uStack_fd8 = uStack_fdc;
                      uStack_fd4 = uStack_fdc;
                      uStack_fd0 = uStack_fdc;
                      uStack_fcc = uStack_fdc;
                      uStack_fc8 = uStack_fdc;
                      uStack_fc4 = uStack_fdc;
                      uStack_fbc = (local_1510.context)->instPrimID[0];
                      local_fc0 = uStack_fbc;
                      uStack_fb8 = uStack_fbc;
                      uStack_fb4 = uStack_fbc;
                      uStack_fb0 = uStack_fbc;
                      uStack_fac = uStack_fbc;
                      uStack_fa8 = uStack_fbc;
                      uStack_fa4 = uStack_fbc;
                      local_1400 = local_11e0._0_8_;
                      uStack_13f8 = local_11e0._8_8_;
                      uStack_13f0 = local_11e0._16_8_;
                      uStack_13e8 = local_11e0._24_8_;
                      local_1510.valid = (int *)&local_1400;
                      local_1510.geometryUserPtr = pGVar45->userPtr;
                      local_1510.hit = local_10c0;
                      local_1510.N = 8;
                      local_1510.ray = (RTCRayN *)ray;
                      if (pGVar45->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        local_14e0._0_4_ = uVar96;
                        auVar58 = ZEXT1632(auVar95._0_16_);
                        (*pGVar45->intersectionFilterN)(&local_1510);
                        auVar53 = ZEXT3264(local_14a0);
                        auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                        auVar95 = ZEXT3264(auVar58);
                        pGVar45 = local_1480;
                        uVar96 = local_14e0._0_4_;
                      }
                      auVar8._8_8_ = uStack_13f8;
                      auVar8._0_8_ = local_1400;
                      auVar8._16_8_ = uStack_13f0;
                      auVar8._24_8_ = uStack_13e8;
                      auVar49 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar8);
                      auVar58 = auVar95._0_32_ & ~auVar49;
                      if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar58 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar58 >> 0x7f,0) == '\0') &&
                            (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar58 >> 0xbf,0) == '\0') &&
                          (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar58[0x1f]) {
                        auVar49 = auVar49 ^ auVar95._0_32_;
                      }
                      else {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar45->field_8).field_0x2 & 0x40) != 0)))) {
                          local_14e0._0_4_ = uVar96;
                          auVar58 = ZEXT1632(auVar95._0_16_);
                          (*p_Var4)(&local_1510);
                          auVar53 = ZEXT3264(local_14a0);
                          auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                          auVar95 = ZEXT3264(auVar58);
                          pGVar45 = local_1480;
                          uVar96 = local_14e0._0_4_;
                        }
                        auVar33._8_8_ = uStack_13f8;
                        auVar33._0_8_ = local_1400;
                        auVar33._16_8_ = uStack_13f0;
                        auVar33._24_8_ = uStack_13e8;
                        auVar90 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
                        auVar49 = auVar90 ^ auVar95._0_32_;
                        auVar58 = auVar95._0_32_ & ~auVar90;
                        if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar58 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar58 >> 0x7f,0) != '\0') ||
                              (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar58 >> 0xbf,0) != '\0') ||
                            (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar58[0x1f] < '\0') {
                          auVar63._0_4_ = auVar90._0_4_ ^ auVar95._0_4_;
                          auVar63._4_4_ = auVar90._4_4_ ^ auVar95._4_4_;
                          auVar63._8_4_ = auVar90._8_4_ ^ auVar95._8_4_;
                          auVar63._12_4_ = auVar90._12_4_ ^ auVar95._12_4_;
                          auVar63._16_4_ = auVar90._16_4_ ^ auVar95._16_4_;
                          auVar63._20_4_ = auVar90._20_4_ ^ auVar95._20_4_;
                          auVar63._24_4_ = auVar90._24_4_ ^ auVar95._24_4_;
                          auVar63._28_4_ = auVar90._28_4_ ^ auVar95._28_4_;
                          auVar58 = vmaskmovps_avx(auVar63,*(undefined1 (*) [32])local_1510.hit);
                          *(undefined1 (*) [32])(local_1510.ray + 0x180) = auVar58;
                          auVar58 = vmaskmovps_avx(auVar63,*(undefined1 (*) [32])
                                                            (local_1510.hit + 0x20));
                          *(undefined1 (*) [32])(local_1510.ray + 0x1a0) = auVar58;
                          auVar58 = vmaskmovps_avx(auVar63,*(undefined1 (*) [32])
                                                            (local_1510.hit + 0x40));
                          *(undefined1 (*) [32])(local_1510.ray + 0x1c0) = auVar58;
                          auVar58 = vmaskmovps_avx(auVar63,*(undefined1 (*) [32])
                                                            (local_1510.hit + 0x60));
                          *(undefined1 (*) [32])(local_1510.ray + 0x1e0) = auVar58;
                          auVar58 = vmaskmovps_avx(auVar63,*(undefined1 (*) [32])
                                                            (local_1510.hit + 0x80));
                          *(undefined1 (*) [32])(local_1510.ray + 0x200) = auVar58;
                          auVar58 = vpmaskmovd_avx2(auVar63,*(undefined1 (*) [32])
                                                             (local_1510.hit + 0xa0));
                          *(undefined1 (*) [32])(local_1510.ray + 0x220) = auVar58;
                          auVar58 = vpmaskmovd_avx2(auVar63,*(undefined1 (*) [32])
                                                             (local_1510.hit + 0xc0));
                          *(undefined1 (*) [32])(local_1510.ray + 0x240) = auVar58;
                          auVar58 = vpmaskmovd_avx2(auVar63,*(undefined1 (*) [32])
                                                             (local_1510.hit + 0xe0));
                          *(undefined1 (*) [32])(local_1510.ray + 0x260) = auVar58;
                          auVar58 = vpmaskmovd_avx2(auVar63,*(undefined1 (*) [32])
                                                             (local_1510.hit + 0x100));
                          *(undefined1 (*) [32])(local_1510.ray + 0x280) = auVar58;
                        }
                      }
                      if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar49 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar49 >> 0x7f,0) == '\0') &&
                            (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar49 >> 0xbf,0) == '\0') &&
                          (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar49[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar96;
                      }
                      *(undefined4 *)(local_1420 + uVar37 * 4) = 0;
                      uVar48 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar52._4_4_ = uVar48;
                      auVar52._0_4_ = uVar48;
                      auVar52._8_4_ = uVar48;
                      auVar52._12_4_ = uVar48;
                      auVar52._16_4_ = uVar48;
                      auVar52._20_4_ = uVar48;
                      auVar52._24_4_ = uVar48;
                      auVar52._28_4_ = uVar48;
                      auVar49 = vcmpps_avx(auVar53._0_32_,auVar52,2);
                      auVar58 = vandps_avx(auVar49,local_1420);
                      local_1420 = local_1420 & auVar49;
                      bVar31 = (local_1420 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar32 = (local_1420 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar30 = (local_1420 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar29 = SUB321(local_1420 >> 0x7f,0) != '\0';
                      bVar28 = (local_1420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar27 = SUB321(local_1420 >> 0xbf,0) != '\0';
                      bVar26 = (local_1420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar25 = local_1420[0x1f] < '\0';
                      if (((((((bVar31 || bVar32) || bVar30) || bVar29) || bVar28) || bVar27) ||
                          bVar26) || bVar25) {
                        auVar64._8_4_ = 0x7f800000;
                        auVar64._0_8_ = 0x7f8000007f800000;
                        auVar64._12_4_ = 0x7f800000;
                        auVar64._16_4_ = 0x7f800000;
                        auVar64._20_4_ = 0x7f800000;
                        auVar64._24_4_ = 0x7f800000;
                        auVar64._28_4_ = 0x7f800000;
                        auVar49 = vblendvps_avx(auVar64,auVar53._0_32_,auVar58);
                        auVar90 = vshufps_avx(auVar49,auVar49,0xb1);
                        auVar90 = vminps_avx(auVar49,auVar90);
                        auVar94 = vshufpd_avx(auVar90,auVar90,5);
                        auVar90 = vminps_avx(auVar90,auVar94);
                        auVar94 = vpermpd_avx2(auVar90,0x4e);
                        auVar90 = vminps_avx(auVar90,auVar94);
                        auVar90 = vcmpps_avx(auVar49,auVar90,0);
                        auVar94 = auVar58 & auVar90;
                        auVar49 = auVar58;
                        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar94 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar94 >> 0x7f,0) != '\0') ||
                              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar94 >> 0xbf,0) != '\0') ||
                            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar94[0x1f] < '\0') {
                          auVar49 = vandps_avx(auVar90,auVar58);
                        }
                        uVar39 = vmovmskps_avx(auVar49);
                        uVar2 = 0;
                        for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x80000000) {
                          uVar2 = uVar2 + 1;
                        }
                        uVar37 = (ulong)uVar2;
                      }
                      local_1420 = auVar58;
                    } while (((((((bVar31 || bVar32) || bVar30) || bVar29) || bVar28) || bVar27) ||
                             bVar26) || bVar25);
                  }
                }
              }
            }
          }
          lVar40 = 0;
          auVar100 = ZEXT1664(local_1350);
          auVar107 = ZEXT1664(local_1360);
          auVar115 = ZEXT1664(local_1370);
          auVar95 = ZEXT1664(local_14b0);
          fVar116 = local_1380;
          fVar119 = fStack_137c;
          fVar120 = fStack_1378;
          fVar121 = fStack_1374;
          fVar122 = local_1390;
          fVar124 = fStack_138c;
          fVar125 = fStack_1388;
          fVar126 = fStack_1384;
          fVar127 = local_13a0;
          fVar128 = fStack_139c;
          fVar129 = fStack_1398;
          fVar130 = fStack_1394;
          fVar131 = local_13b0;
          fVar65 = fStack_13ac;
          fVar66 = fStack_13a8;
          fVar67 = fStack_13a4;
          fVar54 = local_13c0;
          fVar68 = fStack_13bc;
          fVar69 = fStack_13b8;
          fVar70 = fStack_13b4;
          fVar140 = local_13d0;
          fVar101 = fStack_13cc;
          fVar108 = fStack_13c8;
          fVar109 = fStack_13c4;
        }
        else {
          pGVar38 = (GridSOA *)(uVar37 & 0xfffffffffffffff0);
          lVar40 = *(long *)(pGVar38 + (ulong)*(uint *)(pGVar38 + 0x2c) + 0x30);
          (pre->super_Precalculations).grid = pGVar38;
        }
        uVar48 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar53 = ZEXT1664(CONCAT412(uVar48,CONCAT48(uVar48,CONCAT44(uVar48,uVar48))));
        if (lVar40 != 0) {
          *(long *)*pauVar42 = lVar40;
          *(undefined4 *)(*pauVar42 + 8) = 0;
          pauVar42 = pauVar42 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }